

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

void __thiscall ON_Bitmap::Dump(ON_Bitmap *this,ON_TextLog *dump)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  ON_FileReference::Dump(&this->m_file_reference,dump);
  uVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])(this);
  ON_TextLog::Print(dump,"width = %d pixels\n",(ulong)uVar1);
  uVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x19])(this);
  ON_TextLog::Print(dump,"height = %d pixels\n",(ulong)uVar1);
  uVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x1a])(this);
  ON_TextLog::Print(dump,"bits per pixel = %d\n",(ulong)uVar1);
  iVar2 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x1c])(this);
  ON_TextLog::Print(dump,"size of image = %zu bytes\n",CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void ON_Bitmap::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  m_file_reference.Dump(dump);
  dump.Print("width = %d pixels\n",Width());
  dump.Print("height = %d pixels\n",Height());
  dump.Print("bits per pixel = %d\n",BitsPerPixel());
  dump.Print("size of image = %zu bytes\n",SizeofImage());
}